

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onRet(RACFGBuilder *this,FuncRetNode *funcRet,RAInstBuilder *ib)

{
  byte bVar1;
  RegMask useRegMask;
  long lVar2;
  BaseBuilder *pBVar3;
  Environment vReg;
  uint uVar4;
  Error EVar5;
  Error EVar6;
  ulong uVar7;
  BaseRAPass *this_00;
  Error unaff_R12D;
  int *piVar8;
  bool bVar9;
  RAWorkReg *workReg;
  BaseRAPass *local_38;
  
  bVar1 = funcRet->field_0x12;
  if ((ulong)bVar1 != 0) {
    lVar2 = *(long *)(*(long *)this + 0x98);
    piVar8 = (int *)&funcRet->field_0x44;
    uVar7 = 0;
    this_00 = (BaseRAPass *)this;
    local_38 = (BaseRAPass *)ib;
    do {
      if (piVar8[-1] == 0) {
LAB_0014b3ea:
        bVar9 = false;
        EVar5 = unaff_R12D;
      }
      else {
        if (3 < uVar7) {
          onRet();
LAB_0014b4f4:
          onRet();
          BaseRAPass::BaseRAPass(this_00);
          (this_00->super_FuncPass).super_Pass._vptr_Pass = (_func_int **)&PTR__X86RAPass_00177c18;
          this_00[1].super_FuncPass.super_Pass._cb = (BaseBuilder *)0x0;
          this_00[1].super_FuncPass.super_Pass._vptr_Pass =
               (_func_int **)&PTR__BaseEmitHelper_00177bc8;
          *(undefined2 *)&this_00[1].super_FuncPass.super_Pass._name = 0;
          this_00->_iEmitHelper = (BaseEmitHelper *)(this_00 + 1);
          return (Error)(this_00 + 1);
        }
        uVar4 = *(uint *)(lVar2 + 0xc0 + uVar7 * 4);
        bVar9 = true;
        EVar5 = 0x19;
        if ((uVar4 >> 8 & 1) != 0) {
          if ((uVar4 & 0xff000000) == 0x16000000) goto LAB_0014b3ea;
          if ((piVar8[-1] & 7U) == 1) {
            uVar4 = *piVar8 - 0x100;
            bVar9 = false;
            EVar5 = unaff_R12D;
            if (uVar4 < 0xfffffeff) {
              this_00 = *(BaseRAPass **)this;
              pBVar3 = (this_00->super_FuncPass).super_Pass._cb;
              if (uVar4 < *(uint *)&pBVar3[1].super_BaseEmitter._logger) {
                vReg = (&(pBVar3[1].super_BaseEmitter._code)->_environment)[uVar4];
                workReg = *(RAWorkReg **)((long)vReg + 0x28);
                EVar5 = 0;
                if (workReg == (RAWorkReg *)0x0) {
                  EVar5 = BaseRAPass::_asWorkReg(this_00,(VirtReg *)vReg,&workReg);
                }
              }
              else {
                EVar5 = 0x1e;
              }
              bVar9 = true;
              if (EVar5 == 0) {
                if (3 < ((byte)workReg[0x21] & 0xf)) goto LAB_0014b4f4;
                useRegMask = *(RegMask *)
                              (*(long *)this + 0x118 + (ulong)((byte)workReg[0x21] & 0xf) * 4);
                this_00 = local_38;
                EVar6 = RAInstBuilder::add((RAInstBuilder *)local_38,workReg,kUse|kRead,useRegMask,
                                           (uint)*(byte *)(lVar2 + 0xc2 + uVar7 * 4),0,useRegMask,
                                           0xff,0,0,0xffffffff);
                bVar9 = EVar6 != 0;
                EVar5 = unaff_R12D;
                if (bVar9) {
                  EVar5 = EVar6;
                }
              }
            }
          }
        }
      }
      if (bVar9) {
        return EVar5;
      }
      uVar7 = uVar7 + 1;
      piVar8 = piVar8 + 4;
      unaff_R12D = EVar5;
    } while (bVar1 != uVar7);
  }
  return 0;
}

Assistant:

Error RACFGBuilder::onRet(FuncRetNode* funcRet, RAInstBuilder& ib) noexcept {
  const FuncDetail& funcDetail = _pass->func()->detail();
  const Operand* opArray = funcRet->operands();
  uint32_t opCount = funcRet->opCount();

  for (uint32_t i = 0; i < opCount; i++) {
    const Operand& op = opArray[i];
    if (op.isNone()) continue;

    const FuncValue& ret = funcDetail.ret(i);
    if (ASMJIT_UNLIKELY(!ret.isReg()))
      return DebugUtils::errored(kErrorInvalidAssignment);

    // Not handled here...
    if (ret.regType() == RegType::kX86_St)
      continue;

    if (op.isReg()) {
      // Register return value.
      const Reg& reg = op.as<Reg>();
      uint32_t vIndex = Operand::virtIdToIndex(reg.id());

      if (vIndex < Operand::kVirtIdCount) {
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

        RegGroup group = workReg->group();
        RegMask inOutRegs = _pass->_availableRegs[group];
        ASMJIT_PROPAGATE(ib.add(workReg, RATiedFlags::kUse | RATiedFlags::kRead, inOutRegs, ret.regId(), 0, inOutRegs, BaseReg::kIdBad, 0));
      }
    }
    else {
      return DebugUtils::errored(kErrorInvalidAssignment);
    }
  }

  return kErrorOk;
}